

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  ppIVar2 = (GImGui->WindowsFocusOrder).Data;
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  if (ppIVar2[(long)iVar1 + -1] != window) {
    iVar5 = 1;
    for (uVar4 = iVar1 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      if (ppIVar2[uVar4] == window) {
        memmove(ppIVar2 + uVar4,ppIVar2 + (ulong)uVar4 + 1,(long)iVar5 << 3);
        (pIVar3->WindowsFocusOrder).Data[(long)(pIVar3->WindowsFocusOrder).Size + -1] = window;
        return;
      }
      iVar5 = iVar5 + 1;
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}